

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_iov.c
# Opt level: O2

mk_iov * mk_iov_create(int n,int offset)

{
  undefined8 *puVar1;
  mk_iov *pmVar2;
  long lVar3;
  
  pmVar2 = (mk_iov *)calloc(1,(long)(n * 0x18 + 0x28));
  if (pmVar2 != (mk_iov *)0x0) {
    pmVar2->io = (iovec *)(pmVar2 + 1);
    pmVar2->buf_to_free = (void **)((long)&pmVar2[1].iov_idx + (long)(n * 0x10));
    pmVar2->iov_idx = offset;
    pmVar2->size = n;
    if (0 < offset) {
      for (lVar3 = 0; (ulong)(uint)offset << 4 != lVar3; lVar3 = lVar3 + 0x10) {
        puVar1 = (undefined8 *)((long)&pmVar2->io->iov_base + lVar3);
        *puVar1 = 0;
        puVar1[1] = 0;
      }
    }
  }
  return pmVar2;
}

Assistant:

struct mk_iov *mk_iov_create(int n, int offset)
{
    int s_all;
    int s_iovec;
    int s_free_buf;
    void *p;
    struct mk_iov *iov;

    s_all      = sizeof(struct mk_iov);       /* main mk_iov structure */
    s_iovec    = (n * sizeof(struct mk_iovec));  /* iovec array size      */
    s_free_buf = (n * sizeof(void *));        /* free buf array        */

    p = mk_mem_alloc_z(s_all + s_iovec + s_free_buf);
    if (!p) {
        return NULL;
    }

    /* Set pointer address */
    iov     = p;
    iov->io = (struct mk_iovec *)((uint8_t *)p + sizeof(struct mk_iov));
    iov->buf_to_free = (void *) ((uint8_t*)p + sizeof(struct mk_iov) + s_iovec);

    mk_iov_init(iov, n, offset);
    return iov;
}